

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     OperateHelperUnary<(unsigned_short)2,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
     ::operate(View<int,_false,_std::allocator<unsigned_long>_> *v,int *param_2)

{
  size_t sVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  
  sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
  if (sVar1 != 0) {
    uVar4 = 0;
    do {
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      if (sVar1 != 0) {
        uVar2 = 0;
        piVar3 = param_2;
        do {
          *piVar3 = *piVar3 + 1;
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
          piVar3 = piVar3 + sVar1;
          uVar2 = uVar2 + 1;
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
        } while (uVar2 < sVar1);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,1);
      param_2 = param_2 + sVar1;
      uVar4 = uVar4 + 1;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
    } while (uVar4 < sVar1);
  }
  View<int,_false,_std::allocator<unsigned_long>_>::shape(v,1);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,1);
  return;
}

Assistant:

static inline void operate
    (
        View<T, false, A>& v, 
        Functor f, 
        T* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperUnary<N-1, Functor, T, A>::operate(v, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }